

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

string * __thiscall
t_cpp_generator::function_signature
          (string *__return_storage_ptr__,t_cpp_generator *this,t_function *tfunction,string *style,
          string *prefix,bool name_params)

{
  bool bVar1;
  uint uVar2;
  t_struct *this_00;
  members_type *this_01;
  string *psVar3;
  undefined8 *puVar4;
  char *__rhs;
  string local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  byte local_34a;
  byte local_349;
  string local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  byte local_302;
  allocator local_301;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  undefined1 local_2a0 [8];
  string exn_cob;
  string cob_type;
  string local_240;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  byte local_49;
  t_struct *ptStack_48;
  bool has_xceptions;
  t_struct *arglist;
  t_type *ttype;
  string *psStack_30;
  bool name_params_local;
  string *prefix_local;
  string *style_local;
  t_function *tfunction_local;
  t_cpp_generator *this_local;
  
  ttype._7_1_ = name_params;
  psStack_30 = prefix;
  prefix_local = style;
  style_local = (string *)tfunction;
  tfunction_local = (t_function *)this;
  this_local = (t_cpp_generator *)__return_storage_ptr__;
  arglist = (t_struct *)t_function::get_returntype(tfunction);
  ptStack_48 = t_function::get_arglist((t_function *)style_local);
  this_00 = t_function::get_xceptions((t_function *)style_local);
  this_01 = t_struct::get_members(this_00);
  bVar1 = std::vector<t_field_*,_std::allocator<t_field_*>_>::empty(this_01);
  local_49 = (bVar1 ^ 0xffU) & 1;
  bVar1 = std::operator==(style,"");
  if (bVar1) {
    bVar1 = is_complex_type(this,&arglist->super_t_type);
    if (bVar1) {
      std::operator+(&local_110,"void ",prefix);
      psVar3 = t_function::get_name_abi_cxx11_((t_function *)style_local);
      std::operator+(&local_f0,&local_110,psVar3);
      std::operator+(&local_d0,&local_f0,"(");
      type_name_abi_cxx11_(&local_140,this,&arglist->super_t_type,false,false);
      std::operator+(&local_b0,&local_d0,&local_140);
      __rhs = "& /* _return */";
      if ((ttype._7_1_ & 1) != 0) {
        __rhs = "& _return";
      }
      std::operator+(&local_90,&local_b0,__rhs);
      argument_list_abi_cxx11_(&local_160,this,ptStack_48,(bool)(ttype._7_1_ & 1),true);
      std::operator+(&local_70,&local_90,&local_160);
      std::operator+(__return_storage_ptr__,&local_70,")");
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
    }
    else {
      type_name_abi_cxx11_(&local_220,this,&arglist->super_t_type,false,false);
      std::operator+(&local_200,&local_220," ");
      std::operator+(&local_1e0,&local_200,prefix);
      psVar3 = t_function::get_name_abi_cxx11_((t_function *)style_local);
      std::operator+(&local_1c0,&local_1e0,psVar3);
      std::operator+(&local_1a0,&local_1c0,"(");
      argument_list_abi_cxx11_(&local_240,this,ptStack_48,(bool)(ttype._7_1_ & 1),false);
      std::operator+(&local_180,&local_1a0,&local_240);
      std::operator+(__return_storage_ptr__,&local_180,")");
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_220);
    }
  }
  else {
    std::__cxx11::string::substr((ulong)(&cob_type.field_2._M_allocated_capacity + 1),(ulong)style);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (&cob_type.field_2._M_allocated_capacity + 1),"Cob");
    std::__cxx11::string::~string((string *)(cob_type.field_2._M_local_buf + 8));
    if (!bVar1) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = "UNKNOWN STYLE";
      __cxa_throw(puVar4,&char_const*::typeinfo,0);
    }
    std::__cxx11::string::string((string *)(exn_cob.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_2a0);
    bVar1 = std::operator==(style,"CobCl");
    if (bVar1) {
      std::operator+(&local_2e0,"(",&(this->super_t_oop_generator).super_t_generator.service_name_);
      std::operator+(&local_2c0,&local_2e0,"CobClient");
      std::__cxx11::string::operator=
                ((string *)(exn_cob.field_2._M_local_buf + 8),(string *)&local_2c0);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::__cxx11::string::~string((string *)&local_2e0);
      if ((this->gen_templates_ & 1U) != 0) {
        std::__cxx11::string::operator+=
                  ((string *)(exn_cob.field_2._M_local_buf + 8),"T<Protocol_>");
      }
      std::__cxx11::string::operator+=((string *)(exn_cob.field_2._M_local_buf + 8),"* client)");
    }
    else {
      bVar1 = std::operator==(style,"CobSv");
      if (!bVar1) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar4 = "UNKNOWN STYLE";
        __cxa_throw(puVar4,&char_const*::typeinfo,0);
      }
      local_302 = 0;
      local_349 = 0;
      local_34a = 0;
      uVar2 = (*(arglist->super_t_type).super_t_doc._vptr_t_doc[4])();
      if ((uVar2 & 1) == 0) {
        type_name_abi_cxx11_(&local_348,this,&arglist->super_t_type,false,false);
        local_349 = 1;
        std::operator+(&local_328,"(",&local_348);
        local_34a = 1;
        std::operator+(&local_300,&local_328," const& _return)");
      }
      else {
        std::allocator<char>::allocator();
        local_302 = 1;
        std::__cxx11::string::string((string *)&local_300,"()",&local_301);
      }
      std::__cxx11::string::operator=
                ((string *)(exn_cob.field_2._M_local_buf + 8),(string *)&local_300);
      std::__cxx11::string::~string((string *)&local_300);
      if ((local_34a & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_328);
      }
      if ((local_349 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_348);
      }
      if ((local_302 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_301);
      }
      if ((local_49 & 1) != 0) {
        std::__cxx11::string::operator=
                  ((string *)local_2a0,
                   ", ::std::function<void(::apache::thrift::TDelayedException* _throw)> /* exn_cob */"
                  );
      }
    }
    std::operator+(&local_430,"void ",prefix);
    psVar3 = t_function::get_name_abi_cxx11_((t_function *)style_local);
    std::operator+(&local_410,&local_430,psVar3);
    std::operator+(&local_3f0,&local_410,"(::std::function<void");
    std::operator+(&local_3d0,&local_3f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&exn_cob.field_2 + 8));
    std::operator+(&local_3b0,&local_3d0,"> cob");
    std::operator+(&local_390,&local_3b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0);
    argument_list_abi_cxx11_(&local_450,this,ptStack_48,(bool)(ttype._7_1_ & 1),true);
    std::operator+(&local_370,&local_390,&local_450);
    std::operator+(__return_storage_ptr__,&local_370,")");
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_450);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&local_430);
    std::__cxx11::string::~string((string *)local_2a0);
    std::__cxx11::string::~string((string *)(exn_cob.field_2._M_local_buf + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

string t_cpp_generator::function_signature(t_function* tfunction,
                                           string style,
                                           string prefix,
                                           bool name_params) {
  t_type* ttype = tfunction->get_returntype();
  t_struct* arglist = tfunction->get_arglist();
  bool has_xceptions = !tfunction->get_xceptions()->get_members().empty();

  if (style == "") {
    if (is_complex_type(ttype)) {
      return "void " + prefix + tfunction->get_name() + "(" + type_name(ttype)
             + (name_params ? "& _return" : "& /* _return */")
             + argument_list(arglist, name_params, true) + ")";
    } else {
      return type_name(ttype) + " " + prefix + tfunction->get_name() + "("
             + argument_list(arglist, name_params) + ")";
    }
  } else if (style.substr(0, 3) == "Cob") {
    string cob_type;
    string exn_cob;
    if (style == "CobCl") {
      cob_type = "(" + service_name_ + "CobClient";
      if (gen_templates_) {
        cob_type += "T<Protocol_>";
      }
      cob_type += "* client)";
    } else if (style == "CobSv") {
      cob_type = (ttype->is_void() ? "()" : ("(" + type_name(ttype) + " const& _return)"));
      if (has_xceptions) {
        exn_cob
            = ", ::std::function<void(::apache::thrift::TDelayedException* _throw)> /* exn_cob */";
      }
    } else {
      throw "UNKNOWN STYLE";
    }

    return "void " + prefix + tfunction->get_name() + "(::std::function<void" + cob_type + "> cob"
           + exn_cob + argument_list(arglist, name_params, true) + ")";
  } else {
    throw "UNKNOWN STYLE";
  }
}